

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# si_function.hpp
# Opt level: O1

vector __thiscall
sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::grad
          (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *this,vector *p)

{
  char cVar1;
  long in_RDX;
  Index extraout_RDX;
  vector vVar2;
  undefined1 local_38 [16];
  Index *local_28;
  
  cVar1 = *(char *)((long)&p[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows + 1);
  if ((char)p[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
      '\x01') {
    if (cVar1 == '\0') {
      if (p[4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          *(long *)(in_RDX + 8)) goto LAB_0010eed2;
      local_28 = &p[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_38,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_28);
      basis_function::grad_convolution_sum<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                ((basis_function *)this,(vector *)local_38,
                 (cartesian_cubic<float> *)
                 (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows);
    }
    else {
      if (p[4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          *(long *)(in_RDX + 8)) {
LAB_0010eed2:
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                     );
      }
      local_28 = &p[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_38,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_28);
      basis_function::grad_convolution_sum_h<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                ((vector *)this,(cartesian_cubic<float> *)local_38,
                 (double *)
                 (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows);
    }
  }
  else if (cVar1 == '\0') {
    if (p[4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
        *(long *)(in_RDX + 8)) goto LAB_0010eed2;
    local_28 = &p[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
    ;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_38,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_28);
    basis_function::grad_convolution_sum<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
              ((basis_function *)this,(vector *)local_38,
               (cartesian_cubic<float> *)
               (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows,
               (cartesian_cubic<float> **)(p + 1));
  }
  else {
    if (p[4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
        *(long *)(in_RDX + 8)) goto LAB_0010eed2;
    local_28 = &p[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
    ;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_38,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_28);
    basis_function::grad_convolution_sum_h<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
              ((vector *)this,(cartesian_cubic<float> *)local_38,
               (cartesian_cubic<float> **)
               (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows,
               (double *)(p + 1));
  }
  free((void *)local_38._0_8_);
  vVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  vVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (vector)vVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

virtual const vector grad(const vector &p) const {
            if(_bUseBasisDerivative && BF::has_derivative()) {
                if(!_bForceScale)
                    return BF::template grad_convolution_sum<N, L, BF>(
                            _mSpaceTransform*p,
                            (const L*)_lattice);
                return BF::template grad_convolution_sum_h<N, L, BF>(
                        _mSpaceTransform*p,
                        (const L*)_lattice,
                        _dBasisScale);

            }
            if(!_bForceScale)
                return BF::template grad_convolution_sum<N, L, BF>(
                        _mSpaceTransform*p,
                        (const L*)_lattice,
                        (const L**)_d);
            return BF::template grad_convolution_sum_h<N, L, BF>(
                        _mSpaceTransform*p,
                        (const L*)_lattice,
                        (const L**)_d,
                        _dBasisScale);

        }